

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O2

int ParseFile_BuildDb(TCascStorage *hs,void *pvListFile)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  TCHAR *pTVar4;
  int iVar5;
  QUERY_KEY TagString;
  CASC_CSV Csv;
  
  TagString.pbData = (LPBYTE)0x0;
  TagString.cbData = 0;
  CASC_CSV::CASC_CSV(&Csv);
  sVar3 = CASC_CSV::LoadNextLine(&Csv,pvListFile);
  iVar5 = 1000;
  iVar1 = iVar5;
  if (sVar3 != 0) {
    iVar1 = CASC_CSV::GetData(&Csv,&hs->CdnBuildKey,0,true);
    if (iVar1 == 0) {
      iVar1 = CASC_CSV::GetData(&Csv,&hs->CdnConfigKey,1,true);
      if (iVar1 == 0) {
        iVar2 = CASC_CSV::GetData(&Csv,&TagString,2,false);
        if ((iVar2 == 0) && (TagString.pbData != (LPBYTE)0x0)) {
          GetDefaultLocaleMask(hs,&TagString);
          FreeCascBlob(&TagString);
        }
        pTVar4 = CASC_CSV::GetString(&Csv,3);
        hs->szCdnList = pTVar4;
        if (pTVar4 == (TCHAR *)0x0) {
          iVar1 = 0xc;
        }
        else {
          iVar1 = iVar5;
          if (((hs->CdnBuildKey).pbData != (LPBYTE)0x0) &&
             ((hs->CdnConfigKey).pbData != (LPBYTE)0x0)) {
            iVar1 = iVar2;
          }
        }
      }
    }
  }
  CASC_CSV::~CASC_CSV(&Csv);
  return iVar1;
}

Assistant:

static int ParseFile_BuildDb(TCascStorage * hs, void * pvListFile)
{
    QUERY_KEY TagString = {NULL, 0};
    CASC_CSV Csv;
    int nError;

    // Load the single line from the text file
    if(Csv.LoadNextLine(pvListFile) == 0)
        return ERROR_BAD_FORMAT;

    // Extract the CDN build key
    nError = Csv.GetData(hs->CdnBuildKey, 0, true);
    if (nError != ERROR_SUCCESS)
        return nError;

    // Load the CDN config key
    nError = Csv.GetData(hs->CdnConfigKey, 1, true);
    if (nError != ERROR_SUCCESS)
        return nError;

    // Load the the tags
    nError = Csv.GetData(TagString, 2, false);
    if (nError == ERROR_SUCCESS && TagString.pbData != NULL)
    {
        GetDefaultLocaleMask(hs, &TagString);
        FreeCascBlob(&TagString);
    }

    // Load the URL
    hs->szCdnList = Csv.GetString(3);
    if (hs->szCdnList == NULL)
        return ERROR_NOT_ENOUGH_MEMORY;

    // Verify all variables
    if (hs->CdnBuildKey.pbData == NULL || hs->CdnConfigKey.pbData == NULL)
        nError = ERROR_BAD_FORMAT;
    return nError;
}